

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::QuerySurfaceSimplePbufferCase::executeForConfig
          (QuerySurfaceSimplePbufferCase *this,EGLDisplay display,EGLConfig config)

{
  deInt32 a;
  deUint32 dVar1;
  EGLint EVar2;
  int iVar3;
  Library *egl_00;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  undefined4 extraout_var;
  EGLSurface pvVar5;
  MessageBuilder local_a40;
  EGLint local_8bc;
  undefined1 local_8b8 [4];
  EGLint mipmapTexture;
  EGLint local_734;
  undefined1 local_730 [4];
  EGLint textureTarget;
  EGLint local_5ac;
  undefined1 local_5a8 [4];
  EGLint textureFormat;
  EGLint local_424;
  undefined1 local_420 [4];
  EGLint largestPbuffer;
  UniqueSurface surface;
  EGLint attribs [7];
  MessageBuilder local_3e0;
  MessageBuilder local_250;
  undefined1 local_d0 [8];
  ConfigInfo info;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  QuerySurfaceSimplePbufferCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                      m_eglTestCtx);
  this_00 = tcu::TestContext::getLog
                      ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  info.colorComponentType = 0x40;
  info.yuvPlaneBpp = 0x40;
  eglu::ConfigInfo::ConfigInfo((ConfigInfo *)local_d0);
  eglu::queryCoreConfigInfo(egl_00,display,config,(ConfigInfo *)local_d0);
  tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_250,(char (*) [41])"Creating pbuffer surface with config ID ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&info.colorBufferType);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_250);
  dVar1 = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x178);
  dVar1 = info.colorComponentType;
  EVar2 = eglu::getConfigAttribInt(egl_00,display,config,0x302c);
  info.colorComponentType = deMin32(dVar1,EVar2);
  a = info.yuvPlaneBpp;
  EVar2 = eglu::getConfigAttribInt(egl_00,display,config,0x302a);
  info.yuvPlaneBpp = deMin32(a,EVar2);
  if ((info.colorComponentType == 0) || (info.yuvPlaneBpp == 0)) {
    tcu::TestLog::operator<<(&local_3e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_3e0,(char (*) [35])"    Fail, maximum pbuffer size of ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&info.colorComponentType);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b3da7);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&info.yuvPlaneBpp);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [10])" reported");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e0);
    tcu::TestContext::setTestResult
              ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid maximum pbuffer size");
  }
  else {
    surface.m_surface._0_4_ = 0x3057;
    surface.m_surface._4_4_ = info.colorComponentType;
    iVar3 = (*egl_00->_vptr_Library[10])(egl_00,display,config,&surface.m_surface);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)local_420,egl_00,display,(EGLSurface)CONCAT44(extraout_var,iVar3));
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    logCommonSurfaceAttributes(this_00,egl_00,display,pvVar5);
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    logPbufferSurfaceAttributes(this_00,egl_00,display,pvVar5);
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    QuerySurfaceCase::checkCommonAttributes
              (&this->super_QuerySurfaceCase,display,pvVar5,(ConfigInfo *)local_d0);
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    local_424 = eglu::querySurfaceInt(egl_00,display,pvVar5,0x3058);
    if ((local_424 != 0) && (local_424 != 1)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_5a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_5a8,
                          (char (*) [41])"    Fail, invalid largest pbuffer value ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_424);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5a8);
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid largest pbuffer");
    }
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    local_5ac = eglu::querySurfaceInt(egl_00,display,pvVar5,0x3080);
    if (((local_5ac != 0x305c) && (local_5ac != 0x305d)) && (local_5ac != 0x305e)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_730,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_730,
                          (char (*) [40])"    Fail, invalid texture format value ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_5ac);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_730);
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid texture format");
    }
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    local_734 = eglu::querySurfaceInt(egl_00,display,pvVar5,0x3081);
    if ((local_734 != 0x305c) && (local_734 != 0x305f)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_8b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_8b8,
                          (char (*) [40])"    Fail, invalid texture target value ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_734);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_8b8);
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid texture target");
    }
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)local_420);
    local_8bc = eglu::querySurfaceInt(egl_00,display,pvVar5,0x3082);
    if ((local_8bc != 0) && (local_8bc != 1)) {
      tcu::TestLog::operator<<(&local_a40,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_a40,(char (*) [40])"    Fail, invalid mipmap texture value ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_8bc);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a40);
      tcu::TestContext::setTestResult
                ((this->super_QuerySurfaceCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid mipmap texture");
    }
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_420);
  }
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		tcu::TestLog&	log		= m_testCtx.getLog();
		int				width	= 64;
		int				height	= 64;
		ConfigInfo		info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pbuffer surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		// Clamp to maximums reported by implementation
		width	= deMin32(width, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_WIDTH));
		height	= deMin32(height, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_HEIGHT));

		if (width == 0 || height == 0)
		{
			log << TestLog::Message << "    Fail, maximum pbuffer size of " << width << "x" << height << " reported" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid maximum pbuffer size");
			return;
		}

		const EGLint attribs[] =
		{
			EGL_WIDTH,			width,
			EGL_HEIGHT,			height,
			EGL_TEXTURE_FORMAT,	EGL_NO_TEXTURE,
			EGL_NONE
		};

		{
			eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, attribs));

			logCommonSurfaceAttributes	(log, egl, display, *surface);
			logPbufferSurfaceAttributes	(log, egl, display, *surface);
			checkCommonAttributes		(display, *surface, info);

			// Pbuffer-specific attributes

			// Largest pbuffer
			{
				const EGLint	largestPbuffer	= eglu::querySurfaceInt(egl, display, *surface, EGL_LARGEST_PBUFFER);

				if (largestPbuffer != EGL_FALSE && largestPbuffer != EGL_TRUE)
				{
					log << TestLog::Message << "    Fail, invalid largest pbuffer value " << largestPbuffer << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid largest pbuffer");
				}
			}

			// Texture format
			{
				const EGLint	textureFormat	= eglu::querySurfaceInt(egl, display, *surface, EGL_TEXTURE_FORMAT);

				if (textureFormat != EGL_NO_TEXTURE && textureFormat != EGL_TEXTURE_RGB && textureFormat != EGL_TEXTURE_RGBA)
				{
					log << TestLog::Message << "    Fail, invalid texture format value " << textureFormat << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid texture format");
				}
			}

			// Texture target
			{
				const EGLint	textureTarget	= eglu::querySurfaceInt(egl, display, *surface, EGL_TEXTURE_TARGET);

				if (textureTarget != EGL_NO_TEXTURE && textureTarget != EGL_TEXTURE_2D)
				{
					log << TestLog::Message << "    Fail, invalid texture target value " << textureTarget << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid texture target");
				}
			}

			// Mipmap texture
			{
				const EGLint	mipmapTexture	= eglu::querySurfaceInt(egl, display, *surface, EGL_MIPMAP_TEXTURE);

				if (mipmapTexture != EGL_FALSE && mipmapTexture != EGL_TRUE)
				{
					log << TestLog::Message << "    Fail, invalid mipmap texture value " << mipmapTexture << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid mipmap texture");
				}
			}
		}
	}